

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

bool __thiscall
duckdb::UpdateSegment::HasUpdates(UpdateSegment *this,idx_t start_row_index,idx_t end_row_index)

{
  ulong uVar1;
  bool bVar2;
  StorageLockKey *pSVar3;
  idx_t vector_idx;
  UndoBufferPointer UVar4;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> read_lock;
  _Head_base<0UL,_duckdb::StorageLockKey_*,_false> local_30;
  
  pSVar3 = (StorageLockKey *)&this->lock;
  StorageLock::GetSharedLock((StorageLock *)&local_30);
  if ((this->root).super_unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::UpdateNode_*,_std::default_delete<duckdb::UpdateNode>_>.
      super__Head_base<0UL,_duckdb::UpdateNode_*,_false>._M_head_impl != (UpdateNode *)0x0) {
    vector_idx = start_row_index >> 0xb;
    uVar1 = end_row_index >> 0xb;
    bVar2 = vector_idx <= uVar1;
    if (uVar1 < vector_idx) goto LAB_00605b6e;
    do {
      unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::
      operator*((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                 *)&local_30);
      UVar4 = GetUpdateNode(this,pSVar3,vector_idx);
      if (UVar4.entry != (UndoBufferEntry *)0x0) {
        bVar2 = true;
        goto LAB_00605b6e;
      }
      vector_idx = vector_idx + 1;
    } while (uVar1 + 1 != vector_idx);
  }
  bVar2 = false;
LAB_00605b6e:
  if ((element_type *)local_30._M_head_impl != (element_type *)0x0) {
    StorageLockKey::~StorageLockKey(local_30._M_head_impl);
    operator_delete(local_30._M_head_impl);
  }
  return bVar2;
}

Assistant:

bool UpdateSegment::HasUpdates(idx_t start_row_index, idx_t end_row_index) {
	auto read_lock = lock.GetSharedLock();
	if (!root) {
		return false;
	}
	idx_t base_vector_index = start_row_index / STANDARD_VECTOR_SIZE;
	idx_t end_vector_index = end_row_index / STANDARD_VECTOR_SIZE;
	for (idx_t i = base_vector_index; i <= end_vector_index; i++) {
		auto entry = GetUpdateNode(*read_lock, i);
		if (entry.IsSet()) {
			return true;
		}
	}
	return false;
}